

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QtPrivate::
QExplicitlySharedDataPointerV2<QMapData<std::map<unsigned_int,_xcb_visualtype_t,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_xcb_visualtype_t>_>_>_>_>
::~QExplicitlySharedDataPointerV2
          (QExplicitlySharedDataPointerV2<QMapData<std::map<unsigned_int,_xcb_visualtype_t,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_xcb_visualtype_t>_>_>_>_>
           *this)

{
  QMapData<std::map<unsigned_int,_xcb_visualtype_t,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_xcb_visualtype_t>_>_>_>
  *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QMapData<std::map<unsigned_int,_xcb_visualtype_t,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_xcb_visualtype_t>_>_>_>
                 *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      pQVar1 = (this->d).ptr;
      if (pQVar1 != (QMapData<std::map<unsigned_int,_xcb_visualtype_t,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_xcb_visualtype_t>_>_>_>
                     *)0x0) {
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_xcb_visualtype_t>,_std::_Select1st<std::pair<const_unsigned_int,_xcb_visualtype_t>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_xcb_visualtype_t>_>_>
        ::~_Rb_tree(&(pQVar1->m)._M_t);
      }
      operator_delete(pQVar1,0x38);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }